

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall
Memory::Recycler::ExplicitFreeInternalWrapper<(Memory::ObjectInfoBits)32>
          (Recycler *this,void *buffer,size_t size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x484,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) goto LAB_00719f98;
    *puVar3 = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x485,"(size > 0)","size > 0");
    if (!bVar2) {
LAB_00719f98:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ExplicitFreePhase);
  if (!bVar2) {
    sVar4 = GetAllocSize(this,size);
    if (sVar4 < 0x301) {
      bVar2 = ExplicitFreeInternal<(Memory::ObjectInfoBits)32,SmallAllocationBlockAttributes>
                        (this,buffer,size,(ulong)((int)sVar4 + 0xfU & 0x7f0));
      return bVar2;
    }
    if (sVar4 - 0x301 < 0x1d00) {
      bVar2 = ExplicitFreeInternal<(Memory::ObjectInfoBits)32,MediumAllocationBlockAttributes>
                        (this,buffer,size,(ulong)((int)sVar4 + 0xffU & 0x7f00));
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Recycler::ExplicitFreeInternalWrapper(void* buffer, size_t size)
{
    Assert(buffer != nullptr);
    Assert(size > 0);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ExplicitFreePhase))
    {
        return false;
    }
#endif

    size_t allocSize = GetAllocSize(size);

    if (HeapInfo::IsSmallObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, SmallAllocationBlockAttributes>(buffer, size, HeapInfo::GetAlignedSizeNoCheck(allocSize));
    }

    if (HeapInfo::IsMediumObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, MediumAllocationBlockAttributes>(buffer, size, HeapInfo::GetMediumObjectAlignedSizeNoCheck(allocSize));
    }

    return false;
}